

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_set_frame_refs(AV1_COMMON *cm,int *remapped_ref_idx,int lst_map_idx,int gld_map_idx)

{
  char cVar1;
  int b;
  RefCntBuffer *pRVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  bool bVar4;
  int i_3;
  MV_REFERENCE_FRAME ref_frame_1;
  MV_REFERENCE_FRAME ref_frame;
  int ref_idx;
  int i_2;
  int bwd_end_idx;
  int bwd_start_idx;
  int i_1;
  int fwd_end_idx;
  int fwd_start_idx;
  int offset;
  RefCntBuffer *buf;
  int map_idx;
  int i;
  int ref_flag_list [7];
  REF_FRAME_INFO ref_frame_info [8];
  int cur_frame_sort_idx;
  int cur_order_hint;
  int gld_frame_sort_idx;
  int lst_frame_sort_idx;
  int local_144;
  int local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_10c;
  int local_108 [8];
  REF_FRAME_INFO local_e8 [3];
  REF_FRAME_INFO RStack_40;
  int local_20;
  int local_1c;
  
  local_1c = -1;
  local_20 = -1;
  b = *(int *)(in_RDI + 4);
  iVar3 = 1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x6088) + 0x2c) & 0x1f);
  memset(local_108,0,0x1c);
  for (local_10c = 0; local_10c < 8; local_10c = local_10c + 1) {
    local_e8[local_10c].map_idx = local_10c;
    local_e8[local_10c].sort_idx = -1;
    pRVar2 = *(RefCntBuffer **)(in_RDI + 0x1a0 + (long)local_10c * 8);
    local_e8[local_10c].buf = pRVar2;
    if (pRVar2 != (RefCntBuffer *)0x0) {
      if (pRVar2->order_hint == 0xffffffff) {
        local_144 = -1;
      }
      else {
        local_144 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x6088) + 0x28),
                                      pRVar2->order_hint,b);
        local_144 = iVar3 + local_144;
      }
      local_e8[local_10c].sort_idx = local_144;
      if (local_10c == in_EDX) {
        local_1c = local_e8[local_10c].sort_idx;
      }
      if (local_10c == in_ECX) {
        local_20 = local_e8[local_10c].sort_idx;
      }
    }
  }
  if ((local_1c == -1) || (iVar3 <= local_1c)) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  if ((local_20 == -1) || (iVar3 <= local_20)) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }
  qsort(local_e8,8,0x18,compare_ref_frame_info);
  local_120 = 0;
  local_124 = 7;
  for (local_128 = 0; local_128 < 8; local_128 = local_128 + 1) {
    if (local_e8[local_128].sort_idx == -1) {
      local_120 = local_120 + 1;
    }
    else if (iVar3 <= local_e8[local_128].sort_idx) {
      local_124 = local_128 + -1;
      break;
    }
  }
  local_12c = local_124 + 1;
  local_130 = 7;
  if (local_12c < 8) {
    set_ref_frame_info(in_RSI,6,&RStack_40);
    local_108[6] = 1;
    local_130 = 6;
  }
  if (local_12c <= local_130) {
    set_ref_frame_info(in_RSI,4,local_e8 + local_12c);
    local_108[4] = 1;
    local_12c = local_124 + 2;
  }
  if (local_12c <= local_130) {
    set_ref_frame_info(in_RSI,5,local_e8 + local_12c);
    local_108[5] = 1;
  }
  for (local_134 = local_120; local_134 <= local_124; local_134 = local_134 + 1) {
    if (local_e8[local_134].map_idx == in_EDX) {
      set_ref_frame_info(in_RSI,0,local_e8 + local_134);
      local_108[0] = 1;
    }
    if (local_e8[local_134].map_idx == in_ECX) {
      set_ref_frame_info(in_RSI,3,local_e8 + local_134);
      local_108[3] = 1;
    }
  }
  for (local_138 = 0; local_138 < 5; local_138 = local_138 + 1) {
    cVar1 = "\x02\x03\x05\x06\a"[local_138];
    if (local_108[cVar1 + -1] != 1) {
      while( true ) {
        bVar4 = false;
        if ((local_120 <= local_124) && (bVar4 = true, local_e8[local_124].map_idx != in_EDX)) {
          bVar4 = local_e8[local_124].map_idx == in_ECX;
        }
        if (!bVar4) break;
        local_124 = local_124 + -1;
      }
      if (local_124 < local_120) break;
      set_ref_frame_info(in_RSI,cVar1 + -1,local_e8 + local_124);
      local_108[cVar1 + -1] = 1;
      local_124 = local_124 + -1;
    }
  }
  for (; local_138 < 5; local_138 = local_138 + 1) {
    cVar1 = "\x02\x03\x05\x06\a"[local_138];
    if (local_108[cVar1 + -1] != 1) {
      set_ref_frame_info(in_RSI,cVar1 + -1,local_e8 + local_120);
      local_108[cVar1 + -1] = 1;
    }
  }
  for (local_140 = 0; local_140 < 7; local_140 = local_140 + 1) {
  }
  return;
}

Assistant:

void av1_set_frame_refs(AV1_COMMON *const cm, int *remapped_ref_idx,
                        int lst_map_idx, int gld_map_idx) {
  int lst_frame_sort_idx = -1;
  int gld_frame_sort_idx = -1;

  assert(cm->seq_params->order_hint_info.enable_order_hint);
  assert(cm->seq_params->order_hint_info.order_hint_bits_minus_1 >= 0);
  const int cur_order_hint = (int)cm->current_frame.order_hint;
  const int cur_frame_sort_idx =
      1 << cm->seq_params->order_hint_info.order_hint_bits_minus_1;

  REF_FRAME_INFO ref_frame_info[REF_FRAMES];
  int ref_flag_list[INTER_REFS_PER_FRAME] = { 0, 0, 0, 0, 0, 0, 0 };

  for (int i = 0; i < REF_FRAMES; ++i) {
    const int map_idx = i;

    ref_frame_info[i].map_idx = map_idx;
    ref_frame_info[i].sort_idx = -1;

    RefCntBuffer *const buf = cm->ref_frame_map[map_idx];
    ref_frame_info[i].buf = buf;

    if (buf == NULL) continue;
    // If this assertion fails, there is a reference leak.
    assert(buf->ref_count > 0);

    const int offset = (int)buf->order_hint;
    ref_frame_info[i].sort_idx =
        (offset == -1) ? -1
                       : cur_frame_sort_idx +
                             get_relative_dist(&cm->seq_params->order_hint_info,
                                               offset, cur_order_hint);
    assert(ref_frame_info[i].sort_idx >= -1);

    if (map_idx == lst_map_idx) lst_frame_sort_idx = ref_frame_info[i].sort_idx;
    if (map_idx == gld_map_idx) gld_frame_sort_idx = ref_frame_info[i].sort_idx;
  }

  // Confirm both LAST_FRAME and GOLDEN_FRAME are valid forward reference
  // frames.
  if (lst_frame_sort_idx == -1 || lst_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  if (gld_frame_sort_idx == -1 || gld_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }

  // Sort ref frames based on their frame_offset values.
  qsort(ref_frame_info, REF_FRAMES, sizeof(REF_FRAME_INFO),
        compare_ref_frame_info);

  // Identify forward and backward reference frames.
  // Forward  reference: offset < order_hint
  // Backward reference: offset >= order_hint
  int fwd_start_idx = 0, fwd_end_idx = REF_FRAMES - 1;

  for (int i = 0; i < REF_FRAMES; i++) {
    if (ref_frame_info[i].sort_idx == -1) {
      fwd_start_idx++;
      continue;
    }

    if (ref_frame_info[i].sort_idx >= cur_frame_sort_idx) {
      fwd_end_idx = i - 1;
      break;
    }
  }

  int bwd_start_idx = fwd_end_idx + 1;
  int bwd_end_idx = REF_FRAMES - 1;

  // === Backward Reference Frames ===

  // == ALTREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_end_idx]);
    ref_flag_list[ALTREF_FRAME - LAST_FRAME] = 1;
    bwd_end_idx--;
  }

  // == BWDREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, BWDREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[BWDREF_FRAME - LAST_FRAME] = 1;
    bwd_start_idx++;
  }

  // == ALTREF2_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF2_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[ALTREF2_FRAME - LAST_FRAME] = 1;
  }

  // === Forward Reference Frames ===

  for (int i = fwd_start_idx; i <= fwd_end_idx; ++i) {
    // == LAST_FRAME ==
    if (ref_frame_info[i].map_idx == lst_map_idx) {
      set_ref_frame_info(remapped_ref_idx, LAST_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[LAST_FRAME - LAST_FRAME] = 1;
    }

    // == GOLDEN_FRAME ==
    if (ref_frame_info[i].map_idx == gld_map_idx) {
      set_ref_frame_info(remapped_ref_idx, GOLDEN_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[GOLDEN_FRAME - LAST_FRAME] = 1;
    }
  }

  assert(ref_flag_list[LAST_FRAME - LAST_FRAME] == 1 &&
         ref_flag_list[GOLDEN_FRAME - LAST_FRAME] == 1);

  // == LAST2_FRAME ==
  // == LAST3_FRAME ==
  // == BWDREF_FRAME ==
  // == ALTREF2_FRAME ==
  // == ALTREF_FRAME ==

  // Set up the reference frames in the anti-chronological order.
  static const MV_REFERENCE_FRAME ref_frame_list[INTER_REFS_PER_FRAME - 2] = {
    LAST2_FRAME, LAST3_FRAME, BWDREF_FRAME, ALTREF2_FRAME, ALTREF_FRAME
  };

  int ref_idx;
  for (ref_idx = 0; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];

    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;

    while (fwd_start_idx <= fwd_end_idx &&
           (ref_frame_info[fwd_end_idx].map_idx == lst_map_idx ||
            ref_frame_info[fwd_end_idx].map_idx == gld_map_idx)) {
      fwd_end_idx--;
    }
    if (fwd_start_idx > fwd_end_idx) break;

    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_end_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;

    fwd_end_idx--;
  }

  // Assign all the remaining frame(s), if any, to the earliest reference
  // frame.
  for (; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];
    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;
    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_start_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;
  }

  for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
    assert(ref_flag_list[i] == 1);
  }
}